

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

bool __thiscall
apngasm::APNGAsm::save(APNGAsm *this,string *outputPath,uchar coltype,uint first,uint loops)

{
  uint uVar1;
  pointer pAVar2;
  uchar uVar3;
  FILE *pFVar4;
  char cVar5;
  uchar coltype_00;
  uint uVar6;
  uchar *pimage1;
  uchar *ptemp;
  uchar *ptemp_00;
  uchar *ptemp_01;
  uchar *pimage1_00;
  long lVar7;
  uchar *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  ulong uVar11;
  undefined4 uVar12;
  uint uVar13;
  int iVar14;
  undefined7 in_register_00000011;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  bool bVar24;
  int local_1b0;
  uint zsize;
  ulong local_1a8;
  string *local_1a0;
  int local_194;
  FILE *local_190;
  ulong local_188;
  uchar *local_180;
  ulong local_178;
  ulong local_170;
  undefined8 local_168;
  uchar *local_160;
  ulong local_158;
  undefined8 local_150;
  uint local_148;
  undefined4 uStack_144;
  int local_13c;
  uchar *local_138;
  ulong local_130;
  uchar buf_fcTL [26];
  ulong local_e8;
  ulong local_a8;
  uchar buf_acTL [8];
  uchar png_sign [8];
  uchar buf_IHDR [13];
  uchar png_Software [27];
  
  png_sign[0] = 0x89;
  png_sign[1] = 'P';
  png_sign[2] = 'N';
  png_sign[3] = 'G';
  png_sign[4] = '\r';
  png_sign[5] = '\n';
  png_sign[6] = '\x1a';
  png_sign[7] = '\n';
  builtin_memcpy(png_Software + 0x10,"sembler 3.0",0xb);
  builtin_memcpy(png_Software,"Software",9);
  builtin_memcpy(png_Software + 9,"APNG As",7);
  local_194 = (int)CONCAT71(in_register_00000011,coltype);
  uVar15 = 2;
  if (local_194 != 4) {
    uVar15 = (ulong)((uint)(local_194 == 6) * 3 + 1);
  }
  local_130 = 3;
  if (local_194 != 2) {
    local_130 = uVar15;
  }
  local_148 = 1;
  local_178 = CONCAT44(local_178._4_4_,first);
  local_150 = (uchar *)CONCAT44(local_150._4_4_,loops);
  if (local_194 == 0) {
    if (this->_trnssize == 0) {
LAB_00152f27:
      local_168 = 1;
LAB_00152f31:
      uVar19 = 0;
      local_148 = 0;
      goto LAB_00152f3a;
    }
    uVar19 = (ulong)this->_trns[1];
  }
  else if (coltype == '\x02') {
    if (this->_trnssize == 0) goto LAB_00152f27;
    uVar19 = (ulong)((uint)this->_trns[1] | (uint)this->_trns[3] << 8 | (uint)this->_trns[5] << 0x10
                    );
  }
  else {
    uVar19 = 0;
    if (coltype == '\x03') {
      uVar19 = 0;
      while( true ) {
        uVar6 = (uint)uVar19;
        bVar24 = this->_trnssize == uVar6;
        local_168 = CONCAT71((int7)(uVar15 >> 8),bVar24);
        if (bVar24) break;
        if (this->_trns[uVar19] == '\0') goto LAB_00152f3a;
        uVar15 = uVar19;
        uVar19 = (ulong)(uVar6 + 1);
      }
      goto LAB_00152f31;
    }
  }
  local_168 = 0;
LAB_00152f3a:
  uStack_144 = 0;
  uVar20 = this->_width * (int)local_130;
  uVar6 = this->_height;
  uVar15 = (ulong)(uVar20 * uVar6);
  local_1a0 = outputPath;
  pimage1 = (uchar *)operator_new__(uVar15);
  ptemp = (uchar *)operator_new__(uVar15);
  ptemp_00 = (uchar *)operator_new__(uVar15);
  ptemp_01 = (uchar *)operator_new__(uVar15);
  pimage1_00 = (uchar *)operator_new__(uVar15);
  local_158 = (ulong)uVar20;
  local_138 = (uchar *)operator_new__((ulong)(uVar6 * (uVar20 + 1)));
  local_190 = fopen((local_1a0->_M_dataplus)._M_p,"wb");
  if (local_190 != (FILE *)0x0) {
    local_180 = (uchar *)CONCAT44(local_180._4_4_,uVar20 + 1);
    png_save_uint_32(buf_IHDR,this->_width);
    png_save_uint_32(buf_IHDR + 4,this->_height);
    buf_IHDR[8] = '\b';
    buf_IHDR[9] = (uchar)local_194;
    buf_IHDR[10] = '\0';
    buf_IHDR[0xb] = '\0';
    buf_IHDR[0xc] = '\0';
    lVar7 = (long)(this->_frames).
                  super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_frames).
                  super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    png_save_uint_32(buf_acTL,(int)(lVar7 / 0x430) - (uint)local_178,lVar7 % 0x430);
    png_save_uint_32(buf_acTL + 4,(ulong)local_150 & 0xffffffff);
    fwrite(png_sign,1,8,local_190);
    write_chunk(this,(FILE *)local_190,"IHDR",buf_IHDR,0xd);
    uVar12 = 0;
    if (1 < (ulong)(((long)(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_frames).
                          super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x430)) {
      write_chunk(this,(FILE *)local_190,"acTL",buf_acTL,8);
      uVar12 = (uint)local_178;
    }
    local_178 = CONCAT44(local_178._4_4_,uVar12);
    if (this->_palsize != 0) {
      write_chunk(this,(FILE *)local_190,"PLTE",&this->_palette[0].r,this->_palsize * 3);
    }
    if (this->_trnssize != 0) {
      write_chunk(this,(FILE *)local_190,"tRNS",this->_trns,this->_trnssize);
    }
    *(undefined8 *)((long)&(this->_op_zstream1).zfree + 4) = 0;
    *(undefined8 *)((long)&(this->_op_zstream1).opaque + 4) = 0;
    (this->_op_zstream1).zalloc = (alloc_func)0x0;
    (this->_op_zstream1).zfree = (free_func)0x0;
    deflateInit2_(&this->_op_zstream1,2,8,0xf,8,0,"1.2.11",0x70);
    (this->_op_zstream2).zalloc = (alloc_func)0x0;
    (this->_op_zstream2).zfree = (free_func)0x0;
    *(undefined8 *)((long)&(this->_op_zstream2).zfree + 4) = 0;
    *(undefined8 *)((long)&(this->_op_zstream2).opaque + 4) = 0;
    deflateInit2_(&this->_op_zstream2,2,8,0xf,8,1,"1.2.11",0x70);
    puVar9 = local_180;
    local_1a0 = (string *)CONCAT44(local_1a0._4_4_,this->_height);
    uVar20 = this->_height * (int)local_180;
    uVar22 = (ulong)((uVar20 + 0x3f >> 6) + (uVar20 + 7 >> 3) + uVar20 + 0xb);
    local_160 = (uchar *)operator_new__(uVar22);
    puVar8 = (uchar *)operator_new__(uVar22);
    this->_op_zbuf1 = puVar8;
    local_188 = uVar22;
    puVar8 = (uchar *)operator_new__(uVar22);
    this->_op_zbuf2 = puVar8;
    uVar22 = (ulong)puVar9 & 0xffffffff;
    puVar9 = (uchar *)operator_new__(uVar22);
    this->_row_buf = puVar9;
    local_150 = (uchar *)operator_new__(uVar22);
    this->_sub_row = local_150;
    local_180 = (uchar *)operator_new__(uVar22);
    this->_up_row = local_180;
    puVar8 = (uchar *)operator_new__(uVar22);
    this->_avg_row = puVar8;
    puVar10 = (uchar *)operator_new__(uVar22);
    uVar22 = local_130;
    this->_paeth_row = puVar10;
    *puVar9 = '\0';
    *local_150 = '\x01';
    *local_180 = '\x02';
    *puVar8 = '\x03';
    *puVar10 = '\x04';
    uVar6 = this->_width;
    local_1a8 = (ulong)uVar6;
    this->_next_seq_num = 0;
    for (lVar7 = 0x44; lVar7 != 0x134; lVar7 = lVar7 + 0x28) {
      *(undefined4 *)
       ((long)&(((APNGAsm *)(this->_op + -1))->_frames).
               super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
               super__Vector_impl_data._M_start + lVar7) = 0;
    }
    iVar21 = (int)local_158;
    iVar14 = (int)local_130;
    local_170 = 0;
    deflate_rect_op(this,((this->_frames).
                          super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_pixels,0,0,uVar6,
                    (int)local_1a0,iVar14,iVar21,(int)local_188,0);
    deflate_rect_fin(this,local_160,&zsize,iVar14,iVar21,local_138,(int)local_188,0);
    if ((uint)local_178 != 0) {
      write_IDATs(this,(FILE *)local_190,0,local_160,zsize,uVar20);
      for (lVar7 = 0x44; lVar7 != 0x134; lVar7 = lVar7 + 0x28) {
        *(undefined4 *)
         ((long)&(((APNGAsm *)(this->_op + -1))->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_start + lVar7) = 0;
      }
      iVar21 = (int)local_158;
      deflate_rect_op(this,(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._pixels,0,0,(int)local_1a8,
                      (int)local_1a0,iVar14,iVar21,(int)local_188,0);
      deflate_rect_fin(this,local_160,&zsize,iVar14,iVar21,local_138,(int)local_188,0);
    }
    coltype_00 = (uchar)local_194;
    local_13c = (uint)(coltype_00 == '\x06') * 2;
    uVar16 = (ulong)(uint)local_178;
    if (coltype_00 == '\x04') {
      local_13c = 1;
    }
    local_1b0 = 0;
    local_e8 = 0;
    uVar17 = uVar16;
    while( true ) {
      puVar9 = local_160;
      pAVar2 = (this->_frames).
               super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)(this->_frames).
                    super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pAVar2;
      uVar11 = lVar7 / 0x430;
      if (uVar11 - 1 <= uVar17) break;
      for (lVar7 = 0x44; lVar7 != 0x134; lVar7 = lVar7 + 0x28) {
        *(undefined4 *)
         ((long)&(((APNGAsm *)(this->_op + -1))->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_start + lVar7) = 0;
      }
      uVar11 = uVar17 + 1;
      uVar6 = (uint)uVar22;
      uVar13 = (uint)uVar19;
      get_rect(this,this->_width,this->_height,pAVar2[uVar17]._pixels,pAVar2[uVar17 + 1]._pixels,
               ptemp,coltype_00,uVar6,(uint)local_158,(int)local_188,local_148,uVar13,0);
      local_a8 = (ulong)local_1a0 & 0xffffffff;
      local_150 = (uchar *)(CONCAT44(local_150._4_4_,uVar13) & 0xffffffff000000ff);
      local_178 = local_1a8 & 0xffffffff;
      uVar3 = (uchar)(uVar19 >> 0x10);
      if ((char)local_168 == '\0') {
        pAVar2 = (this->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_start;
        memcpy(pimage1,pAVar2[uVar17]._pixels,uVar15);
        uVar1 = this->_width;
        if ((char)local_194 == '\x02') {
          uVar6 = (local_1b0 * uVar1 + (int)local_170) * 3;
          for (iVar14 = 0; uVar22 = local_178, uVar23 = uVar6, iVar14 != (int)local_1a0;
              iVar14 = iVar14 + 1) {
            while( true ) {
              if (uVar22 == 0) break;
              pimage1[(ulong)uVar23 + 2] = uVar3;
              *(short *)(pimage1 + uVar23) = (short)uVar19;
              uVar22 = uVar22 - 1;
              uVar23 = uVar23 + 3;
            }
            uVar6 = uVar6 + uVar1 * 3;
          }
        }
        else {
          local_180 = (uchar *)(ulong)(uint)((int)local_1a8 << ((byte)local_13c & 0x1f));
          uVar23 = (local_1b0 * uVar1 + (int)local_170) * uVar6;
          uVar22 = local_a8;
          while (bVar24 = uVar22 != 0, uVar22 = uVar22 - 1, bVar24) {
            memset(pimage1 + uVar23,(int)local_150,(size_t)local_180);
            uVar23 = uVar23 + uVar6 * uVar1;
          }
        }
        uVar22 = local_130;
        get_rect(this,uVar1,this->_height,pimage1,pAVar2[uVar11]._pixels,ptemp_00,coltype_00,
                 (uint)local_130,(uint)local_158,(int)local_188,1,uVar13,1);
      }
      if (uVar16 < uVar17) {
        get_rect(this,this->_width,this->_height,pimage1_00,
                 (this->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar11]._pixels,ptemp_01,coltype_00,(uint)uVar22,
                 (uint)local_158,(int)local_188,local_148,uVar13,2);
      }
      uVar6 = this->_op[0].size;
      uVar18 = 0;
      uVar13 = 1;
      for (lVar7 = 0x6c; lVar7 != 0x134; lVar7 = lVar7 + 0x28) {
        if ((*(int *)((long)&(((APNGAsm *)(this->_op + -1))->_frames).
                             super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar7) != 0) &&
           (uVar1 = *(uint *)((long)this->_op + lVar7 + -0x3c), uVar1 < uVar6)) {
          uVar18 = (ulong)uVar13;
          uVar6 = uVar1;
        }
        uVar13 = uVar13 + 1;
      }
      local_180 = (uchar *)CONCAT44(local_180._4_4_,(int)(uVar18 >> 1));
      this->_next_seq_num = this->_next_seq_num + 1;
      png_save_uint_32(buf_fcTL);
      png_save_uint_32(buf_fcTL + 4,local_1a8);
      png_save_uint_32(buf_fcTL + 8,(ulong)local_1a0 & 0xffffffff);
      png_save_uint_32(buf_fcTL + 0xc,local_170);
      png_save_uint_32(buf_fcTL + 0x10,local_1b0);
      png_save_uint_16(buf_fcTL + 0x14,
                       (this->_frames).
                       super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar17]._delayNum);
      png_save_uint_16(buf_fcTL + 0x16,
                       (this->_frames).
                       super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar17]._delayDen);
      pFVar4 = local_190;
      buf_fcTL[0x18] = (uchar)local_180;
      buf_fcTL[0x19] = (uchar)local_e8;
      write_chunk(this,(FILE *)local_190,"fcTL",buf_fcTL,0x1a);
      write_IDATs(this,(FILE *)pFVar4,(int)uVar17,local_160,zsize,uVar20);
      cVar5 = (char)local_180;
      if (((char)local_180 != '\x02') &&
         (memcpy(pimage1_00,
                 (this->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar17]._pixels,uVar15), cVar5 == '\x01')) {
        uVar6 = this->_width;
        if ((char)local_194 == '\x02') {
          uVar13 = ((int)local_170 + local_1b0 * uVar6) * 3;
          for (iVar14 = 0; uVar22 = local_178, uVar1 = uVar13, iVar14 != (int)local_1a0;
              iVar14 = iVar14 + 1) {
            while( true ) {
              if (uVar22 == 0) break;
              pimage1_00[(ulong)uVar1 + 2] = uVar3;
              *(short *)(pimage1_00 + uVar1) = (short)uVar19;
              uVar22 = uVar22 - 1;
              uVar1 = uVar1 + 3;
            }
            uVar13 = uVar13 + uVar6 * 3;
          }
        }
        else {
          local_1a8 = (ulong)(uint)((int)local_1a8 << ((byte)local_13c & 0x1f));
          iVar14 = (int)local_130;
          uVar13 = ((int)local_170 + local_1b0 * uVar6) * iVar14;
          while (bVar24 = local_a8 != 0, local_a8 = local_a8 - 1, bVar24) {
            memset(pimage1_00 + uVar13,(int)local_150,local_1a8);
            uVar13 = uVar13 + uVar6 * iVar14;
          }
        }
      }
      uVar22 = local_130;
      iVar14 = (int)uVar18;
      local_170 = (ulong)(uint)this->_op[iVar14].x;
      local_1b0 = this->_op[iVar14].y;
      local_1a8 = (ulong)(uint)this->_op[iVar14].w;
      local_1a0 = (string *)CONCAT44(local_1a0._4_4_,this->_op[iVar14].h);
      local_e8 = uVar18 & 0xffffff01;
      deflate_rect_fin(this,local_160,&zsize,(int)local_130,(int)local_158,local_138,(int)local_188,
                       iVar14);
      uVar17 = uVar11;
    }
    if (1 < uVar11) {
      uVar6 = this->_next_seq_num;
      this->_next_seq_num = uVar6 + 1;
      png_save_uint_32(buf_fcTL,uVar6,lVar7 % 0x430);
      png_save_uint_32(buf_fcTL + 4,local_1a8);
      png_save_uint_32(buf_fcTL + 8,(ulong)local_1a0 & 0xffffffff);
      png_save_uint_32(buf_fcTL + 0xc,local_170);
      png_save_uint_32(buf_fcTL + 0x10,local_1b0);
      png_save_uint_16(buf_fcTL + 0x14,
                       (this->_frames).
                       super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1]._delayNum);
      png_save_uint_16(buf_fcTL + 0x16,
                       (this->_frames).
                       super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1]._delayDen);
      buf_fcTL[0x18] = '\0';
      buf_fcTL[0x19] = (uchar)local_e8;
      write_chunk(this,(FILE *)local_190,"fcTL",buf_fcTL,0x1a);
      uVar11 = ((long)(this->_frames).
                      super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_frames).
                     super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x430;
    }
    pFVar4 = local_190;
    write_IDATs(this,(FILE *)local_190,(int)uVar11 + -1,puVar9,zsize,uVar20);
    write_chunk(this,(FILE *)pFVar4,"tEXt",png_Software,0x1b);
    write_chunk(this,(FILE *)pFVar4,"IEND",(uchar *)0x0,0);
    fclose(pFVar4);
    operator_delete__(puVar9);
    if (this->_op_zbuf1 != (uchar *)0x0) {
      operator_delete__(this->_op_zbuf1);
    }
    if (this->_op_zbuf2 != (uchar *)0x0) {
      operator_delete__(this->_op_zbuf2);
    }
    if (this->_row_buf != (uchar *)0x0) {
      operator_delete__(this->_row_buf);
    }
    if (this->_sub_row != (uchar *)0x0) {
      operator_delete__(this->_sub_row);
    }
    if (this->_up_row != (uchar *)0x0) {
      operator_delete__(this->_up_row);
    }
    if (this->_avg_row != (uchar *)0x0) {
      operator_delete__(this->_avg_row);
    }
    if (this->_paeth_row != (uchar *)0x0) {
      operator_delete__(this->_paeth_row);
    }
    deflateEnd(&this->_op_zstream1);
    deflateEnd(&this->_op_zstream2);
    operator_delete__(pimage1);
    operator_delete__(ptemp);
    operator_delete__(ptemp_00);
    operator_delete__(ptemp_01);
    operator_delete__(pimage1_00);
    operator_delete__(local_138);
  }
  return local_190 != (FILE *)0x0;
}

Assistant:

bool APNGAsm::save(const std::string &outputPath, unsigned char coltype, unsigned int first, unsigned int loops)
  {
    unsigned int    j, k;
    unsigned int    has_tcolor = 0;
    unsigned int    tcolor = 0;
    unsigned int    i, rowbytes, imagesize;
    unsigned int    idat_size, zbuf_size, zsize;
    unsigned char * zbuf;
    FILE*           f;
    unsigned char   png_sign[8] = {137,  80,  78,  71,  13,  10,  26,  10};
    unsigned char   png_Software[27] = { 83, 111, 102, 116, 119, 97, 114, 101, '\0',
                                         65,  80,  78,  71,  32, 65, 115, 115, 101,
                                        109,  98, 108, 101, 114, 32,  51,  46,  48};

    unsigned int bpp = 1;
    if (coltype == 2)
      bpp = 3;
    else
    if (coltype == 4)
      bpp = 2;
    else
    if (coltype == 6)
      bpp = 4;

    if (coltype == 0)
    {
      if (_trnssize)
      {
        has_tcolor = 1;
        tcolor = _trns[1];
      }
    }
    else
    if (coltype == 2)
    {
      if (_trnssize)
      {
        has_tcolor = 1;
        tcolor = (((_trns[5]<<8)+_trns[3])<<8)+_trns[1];
      }
    }
    else
    if (coltype == 3)
    {
      for (i=0; i<_trnssize; i++)
      if (_trns[i] == 0)
      {
        has_tcolor = 1;
        tcolor = i;
        break;
      }
    }
    else
    {
      has_tcolor = 1;
      tcolor = 0;
    }

    rowbytes  = _width * bpp;
    imagesize = rowbytes * _height;

    unsigned char * temp  = new unsigned char[imagesize];
    unsigned char * over1 = new unsigned char[imagesize];
    unsigned char * over2 = new unsigned char[imagesize];
    unsigned char * over3 = new unsigned char[imagesize];
    unsigned char * prev  = new unsigned char[imagesize];
    unsigned char * rows  = new unsigned char[(rowbytes + 1) * _height];

    if ((f = fopen(outputPath.c_str(), "wb")) != 0)
    {
      unsigned char buf_IHDR[13];
      unsigned char buf_acTL[8];
      unsigned char buf_fcTL[26];

      png_save_uint_32(buf_IHDR, _width);
      png_save_uint_32(buf_IHDR + 4, _height);
      buf_IHDR[8] = 8;
      buf_IHDR[9] = coltype;
      buf_IHDR[10] = 0;
      buf_IHDR[11] = 0;
      buf_IHDR[12] = 0;

      png_save_uint_32(buf_acTL, _frames.size() - first);
      png_save_uint_32(buf_acTL + 4, loops);

      fwrite(png_sign, 1, 8, f);

      write_chunk(f, "IHDR", buf_IHDR, 13);

      if (_frames.size() > 1)
        write_chunk(f, "acTL", buf_acTL, 8);
      else
        first = 0;

      if (_palsize > 0)
        write_chunk(f, "PLTE", (unsigned char *)(&_palette), _palsize*3);

      if (_trnssize > 0)
        write_chunk(f, "tRNS", _trns, _trnssize);

      _op_zstream1.data_type = Z_BINARY;
      _op_zstream1.zalloc = Z_NULL;
      _op_zstream1.zfree = Z_NULL;
      _op_zstream1.opaque = Z_NULL;
      deflateInit2(&_op_zstream1, Z_BEST_SPEED+1, 8, 15, 8, Z_DEFAULT_STRATEGY);

      _op_zstream2.data_type = Z_BINARY;
      _op_zstream2.zalloc = Z_NULL;
      _op_zstream2.zfree = Z_NULL;
      _op_zstream2.opaque = Z_NULL;
      deflateInit2(&_op_zstream2, Z_BEST_SPEED+1, 8, 15, 8, Z_FILTERED);

      idat_size = (rowbytes + 1) * _height;
      zbuf_size = idat_size + ((idat_size + 7) >> 3) + ((idat_size + 63) >> 6) + 11;

      zbuf = new unsigned char[zbuf_size];
      _op_zbuf1 = new unsigned char[zbuf_size];
      _op_zbuf2 = new unsigned char[zbuf_size];
      _row_buf = new unsigned char[rowbytes + 1];
      _sub_row = new unsigned char[rowbytes + 1];
      _up_row = new unsigned char[rowbytes + 1];
      _avg_row = new unsigned char[rowbytes + 1];
      _paeth_row = new unsigned char[rowbytes + 1];

      _row_buf[0] = 0;
      _sub_row[0] = 1;
      _up_row[0] = 2;
      _avg_row[0] = 3;
      _paeth_row[0] = 4;

      unsigned int x0 = 0;
      unsigned int y0 = 0;
      unsigned int w0 = _width;
      unsigned int h0 = _height;
      unsigned char bop = 0;
      unsigned char dop = 0;
      _next_seq_num = 0;

      for (j=0; j<6; j++)
        _op[j].valid = 0;
      deflate_rect_op(_frames[0]._pixels, x0, y0, w0, h0, bpp, rowbytes, zbuf_size, 0);
      deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, 0);

      if (first)
      {
        write_IDATs(f, 0, zbuf, zsize, idat_size);

        for (j=0; j<6; j++)
          _op[j].valid = 0;
        deflate_rect_op(_frames[1]._pixels, x0, y0, w0, h0, bpp, rowbytes, zbuf_size, 0);
        deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, 0);
      }

      for (size_t n = first; n < _frames.size()-1; ++n)
      {
        unsigned int op_min;
        int          op_best;

        for (j=0; j<6; j++)
          _op[j].valid = 0;

        /* dispose = none */
        get_rect(_width, _height, _frames[n]._pixels, _frames[n+1]._pixels, over1, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 0);

        /* dispose = background */
        if (has_tcolor)
        {
          memcpy(temp, _frames[n]._pixels, imagesize);
          if (coltype == 2)
            for (j=0; j<h0; j++)
              for (k=0; k<w0; k++)
                memcpy(temp + ((j+y0)*_width + (k+x0))*3, &tcolor, 3);
          else
            for (j=0; j<h0; j++)
              memset(temp + ((j+y0)*_width + x0)*bpp, tcolor, w0*bpp);

          get_rect(_width, _height, temp, _frames[n+1]._pixels, over2, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 1);
        }

        /* dispose = previous */
        if (n > first)
          get_rect(_width, _height, prev, _frames[n+1]._pixels, over3, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 2);

        op_min = _op[0].size;
        op_best = 0;
        for (j=1; j<6; j++)
        if (_op[j].valid)
        {
          if (_op[j].size < op_min)
          {
            op_min = _op[j].size;
            op_best = j;
          }
        }

        dop = op_best >> 1;

        png_save_uint_32(buf_fcTL, _next_seq_num++);
        png_save_uint_32(buf_fcTL + 4, w0);
        png_save_uint_32(buf_fcTL + 8, h0);
        png_save_uint_32(buf_fcTL + 12, x0);
        png_save_uint_32(buf_fcTL + 16, y0);
        png_save_uint_16(buf_fcTL + 20, _frames[n]._delayNum);
        png_save_uint_16(buf_fcTL + 22, _frames[n]._delayDen);
        buf_fcTL[24] = dop;
        buf_fcTL[25] = bop;
        write_chunk(f, "fcTL", buf_fcTL, 26);

        write_IDATs(f, n, zbuf, zsize, idat_size);

        /* process apng dispose - begin */
        if (dop != 2)
          memcpy(prev, _frames[n]._pixels, imagesize);

        if (dop == 1)
        {
          if (coltype == 2)
            for (j=0; j<h0; j++)
              for (k=0; k<w0; k++)
                memcpy(prev + ((j+y0)*_width + (k+x0))*3, &tcolor, 3);
          else
            for (j=0; j<h0; j++)
              memset(prev + ((j+y0)*_width + x0)*bpp, tcolor, w0*bpp);
        }
        /* process apng dispose - end */

        x0 = _op[op_best].x;
        y0 = _op[op_best].y;
        w0 = _op[op_best].w;
        h0 = _op[op_best].h;
        bop = op_best & 1;

        deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, op_best);
      }

      if (_frames.size() > 1)
      {
        png_save_uint_32(buf_fcTL, _next_seq_num++);
        png_save_uint_32(buf_fcTL + 4, w0);
        png_save_uint_32(buf_fcTL + 8, h0);
        png_save_uint_32(buf_fcTL + 12, x0);
        png_save_uint_32(buf_fcTL + 16, y0);
        png_save_uint_16(buf_fcTL + 20, _frames[_frames.size()-1]._delayNum);
        png_save_uint_16(buf_fcTL + 22, _frames[_frames.size()-1]._delayDen);
        buf_fcTL[24] = 0;
        buf_fcTL[25] = bop;
        write_chunk(f, "fcTL", buf_fcTL, 26);
      }

      write_IDATs(f, _frames.size()-1, zbuf, zsize, idat_size);

      write_chunk(f, "tEXt", png_Software, 27);
      write_chunk(f, "IEND", 0, 0);
      fclose(f);

      delete[] zbuf;
      delete[] _op_zbuf1;
      delete[] _op_zbuf2;
      delete[] _row_buf;
      delete[] _sub_row;
      delete[] _up_row;
      delete[] _avg_row;
      delete[] _paeth_row;

      deflateEnd(&_op_zstream1);
      deflateEnd(&_op_zstream2);
    }
    else
      return false;

    delete[] temp;
    delete[] over1;
    delete[] over2;
    delete[] over3;
    delete[] prev;
    delete[] rows;

    return true;
  }